

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

_Bool check_buffer_below_thresh(AV1_COMP *cpi,int64_t buffer_level,int drop_mark)

{
  int iVar1;
  LAYER_CONTEXT *pLVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  
  if (((cpi->ppi->use_svc == 0) || (iVar1 = (cpi->svc).number_spatial_layers, iVar1 == 1)) ||
     ((cpi->svc).framedrop_mode == AOM_LAYER_DROP)) {
    bVar4 = buffer_level <= drop_mark;
  }
  else {
    for (iVar5 = (cpi->svc).spatial_layer_id; bVar4 = iVar5 < iVar1, iVar5 < iVar1;
        iVar5 = iVar5 + 1) {
      lVar3 = (long)(cpi->svc).temporal_layer_id +
              (long)iVar5 * (long)(cpi->svc).number_temporal_layers;
      pLVar2 = (cpi->svc).layer_context;
      if ((0 < pLVar2[lVar3].target_bandwidth) &&
         (pLVar2[lVar3].p_rc.buffer_level <=
          (long)(int)(((long)(cpi->oxcf).rc_cfg.drop_frames_water_mark *
                      pLVar2[lVar3].p_rc.optimal_buffer_level) / 100))) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

static bool check_buffer_below_thresh(AV1_COMP *cpi, int64_t buffer_level,
                                      int drop_mark) {
  SVC *svc = &cpi->svc;
  if (!cpi->ppi->use_svc || cpi->svc.number_spatial_layers == 1 ||
      cpi->svc.framedrop_mode == AOM_LAYER_DROP) {
    return (buffer_level <= drop_mark);
  } else {
    // For SVC in the AOM_FULL_SUPERFRAME_DROP): the condition on
    // buffer is checked on current and upper spatial layers.
    for (int i = svc->spatial_layer_id; i < svc->number_spatial_layers; ++i) {
      const int layer = LAYER_IDS_TO_IDX(i, svc->temporal_layer_id,
                                         svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      PRIMARY_RATE_CONTROL *lrc = &lc->p_rc;
      // Exclude check for layer whose bitrate is 0.
      if (lc->target_bandwidth > 0) {
        const int drop_thresh = cpi->oxcf.rc_cfg.drop_frames_water_mark;
        const int drop_mark_layer =
            (int)(drop_thresh * lrc->optimal_buffer_level / 100);
        if (lrc->buffer_level <= drop_mark_layer) return true;
      }
    }
    return false;
  }
}